

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmem.h
# Opt level: O0

void __thiscall mappedmem::mappedmem(mappedmem *this,int f,uint64_t start,uint64_t end,int mmapmode)

{
  int __v;
  long lVar1;
  int *piVar2;
  uint64_t __offset;
  uint64_t uVar3;
  uint8_t *puVar4;
  system_error *this_00;
  error_category *__ecat;
  uint64_t phys_end;
  uint64_t phys_start;
  uint64_t local_38;
  uint64_t pagesize;
  uint64_t uStack_28;
  int mmapmode_local;
  uint64_t end_local;
  uint64_t start_local;
  mappedmem *pmStack_10;
  int f_local;
  mappedmem *this_local;
  
  phys_start._4_4_ = 0x1000;
  pagesize._4_4_ = mmapmode;
  uStack_28 = end;
  end_local = start;
  start_local._4_4_ = f;
  pmStack_10 = this;
  lVar1 = sysconf(0x1e);
  phys_start._0_4_ = (undefined4)lVar1;
  piVar2 = std::max<int>((int *)((long)&phys_start + 4),(int *)&phys_start);
  local_38 = (uint64_t)*piVar2;
  __offset = round_down(end_local,local_38);
  uVar3 = round_up(uStack_28,local_38);
  this->phys_length = uVar3 - __offset;
  this->length = uStack_28 - end_local;
  this->dataofs = end_local - __offset;
  if (this->phys_length == 0) {
    this->pmem = (uint8_t *)0x0;
  }
  else {
    puVar4 = (uint8_t *)
             mmap((void *)0x0,this->phys_length,pagesize._4_4_,1,start_local._4_4_,__offset);
    this->pmem = puVar4;
    if (this->pmem == (uint8_t *)0xffffffffffffffff) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar2 = __errno_location();
      __v = *piVar2;
      __ecat = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(this_00,__v,__ecat,"mmap");
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return;
}

Assistant:

mappedmem(int f, uint64_t start, uint64_t end, int mmapmode= PROT_READ|PROT_WRITE)
    {
        uint64_t pagesize= std::max(0x1000, (int)sysconf(_SC_PAGE_SIZE));

        uint64_t phys_start= round_down(start, pagesize);
        uint64_t phys_end= round_up(end, pagesize);

        phys_length= phys_end - phys_start;
        length = end - start;
        dataofs= start - phys_start;

        if (phys_length==0) {
            pmem = NULL;
            return;
        }
        pmem= (uint8_t*)mymmap(NULL, phys_length, mmapmode, MAP_SHARED, f, mmapoffset(phys_start));
        if (pmem==MAP_FAILED)
            throw std::system_error(errno, std::generic_category(), "mmap");
    }